

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.h
# Opt level: O0

void __thiscall
jrtplib::RTPUDPv4TransmissionInfo::~RTPUDPv4TransmissionInfo(RTPUDPv4TransmissionInfo *this)

{
  RTPUDPv4TransmissionInfo *this_local;
  
  (this->super_RTPTransmissionInfo)._vptr_RTPTransmissionInfo =
       (_func_int **)&PTR__RTPUDPv4TransmissionInfo_00193128;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list(&this->localIPlist);
  RTPTransmissionInfo::~RTPTransmissionInfo(&this->super_RTPTransmissionInfo);
  return;
}

Assistant:

~RTPUDPv4TransmissionInfo()								{ }